

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O1

void VP8LBitsEntropyUnrefined(uint32_t *array,int n,VP8LBitEntropy *entropy)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  
  entropy->entropy = 0;
  entropy->sum = 0;
  entropy->nonzeros = 0;
  entropy->max_val = 0;
  entropy->nonzero_code = 0xffff;
  if (0 < n) {
    uVar5 = 0;
    do {
      uVar3 = array[uVar5];
      if ((ulong)uVar3 != 0) {
        entropy->nonzero_code = (uint32_t)uVar5;
        uVar1 = entropy->sum;
        uVar2 = entropy->nonzeros;
        entropy->sum = uVar3 + uVar1;
        entropy->nonzeros = uVar2 + 1;
        if (uVar3 < 0x100) {
          uVar4 = kSLog2Table[uVar3];
        }
        else {
          uVar4 = (*VP8LFastSLog2Slow)(uVar3);
        }
        entropy->entropy = entropy->entropy + uVar4;
        if (entropy->max_val < uVar3) {
          entropy->max_val = uVar3;
        }
      }
      uVar5 = uVar5 + 1;
    } while ((uint)n != uVar5);
  }
  uVar3 = entropy->sum;
  if ((ulong)uVar3 < 0x100) {
    uVar4 = kSLog2Table[uVar3];
  }
  else {
    uVar4 = (*VP8LFastSLog2Slow)(uVar3);
  }
  entropy->entropy = uVar4 - entropy->entropy;
  return;
}

Assistant:

void VP8LBitsEntropyUnrefined(const uint32_t* WEBP_RESTRICT const array, int n,
                              VP8LBitEntropy* WEBP_RESTRICT const entropy) {
  int i;

  VP8LBitEntropyInit(entropy);

  for (i = 0; i < n; ++i) {
    if (array[i] != 0) {
      entropy->sum += array[i];
      entropy->nonzero_code = i;
      ++entropy->nonzeros;
      entropy->entropy += VP8LFastSLog2(array[i]);
      if (entropy->max_val < array[i]) {
        entropy->max_val = array[i];
      }
    }
  }
  entropy->entropy = VP8LFastSLog2(entropy->sum) - entropy->entropy;
}